

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

int Dtc_ObjComputeTruth(Gia_Man_t *p,int iObj,int *pCut,int *pTruth)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  
  if (0 < *pCut) {
    puVar3 = &DAT_0095c0c8;
    lVar4 = 0;
    do {
      iVar1 = pCut[lVar4 + 1];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005d8bad;
      p->pObjs[iVar1].Value = *puVar3;
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + 1;
    } while (lVar4 < *pCut);
  }
  if (((-1 < iObj) && (iObj < p->nObjs)) &&
     (uVar2 = Dtc_ObjComputeTruth_rec(p->pObjs + (uint)iObj), iObj < p->nObjs)) {
    Dtc_ObjCleanTruth_rec(p->pObjs + (uint)iObj);
    if (pTruth != (int *)0x0) {
      *pTruth = uVar2 & 0xff;
    }
    uVar2 = uVar2 & 0xff;
    if (uVar2 < 0x8e) {
      if ((0x36 < uVar2 - 0x17) || ((0x40000000100001U >> ((ulong)(uVar2 - 0x17) & 0x3f) & 1) == 0))
      {
        if (uVar2 == 0x69) {
          return 1;
        }
        if (uVar2 != 0x71) {
          return 0;
        }
      }
    }
    else if (((0x36 < uVar2 - 0xb2) ||
             ((0x40000400000001U >> ((ulong)(uVar2 - 0xb2) & 0x3f) & 1) == 0)) && (uVar2 != 0x8e)) {
      if (uVar2 != 0x96) {
        return 0;
      }
      return 1;
    }
    return 2;
  }
LAB_005d8bad:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Dtc_ObjComputeTruth( Gia_Man_t * p, int iObj, int * pCut, int * pTruth )
{
    unsigned Truth, Truths[3] = { 0xAA, 0xCC, 0xF0 }; int i;
    for ( i = 1; i <= pCut[0]; i++ )
        Gia_ManObj(p, pCut[i])->Value = Truths[i-1];
    Truth = 0xFF & Dtc_ObjComputeTruth_rec( Gia_ManObj(p, iObj) );
    Dtc_ObjCleanTruth_rec( Gia_ManObj(p, iObj) );
    if ( pTruth ) 
        *pTruth = Truth;
    if ( Truth == 0x96 || Truth == 0x69 )
        return 1;
    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        return 2;
    return 0;
}